

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

bool Assimp::IFC::GenerateOpenings
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                *openings,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors,
               TempMesh *curmesh,bool check_intersection,bool generate_connection_geometry,
               IfcVector3 *wall_extrusion_axis)

{
  double *pdVar1;
  uint uVar2;
  element_type *peVar3;
  double *pdVar4;
  double *pdVar5;
  iterator __position;
  pointer paVar6;
  undefined8 poly_00;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  IfcVector3 *v3;
  aiMatrix4x4t<double> *paVar10;
  double *pdVar11;
  undefined7 extraout_var;
  undefined7 in_register_00000009;
  long lVar12;
  pointer pTVar13;
  element_type *__x;
  iterator __position_00;
  IfcMatrix4 *pIVar14;
  TempMesh *pTVar15;
  vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *this;
  undefined7 in_register_00000081;
  long lVar16;
  uint uVar17;
  TempOpening *__tmp;
  pointer pTVar18;
  bool bVar19;
  byte bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  pointer paVar24;
  double dVar25;
  double dVar26;
  pointer paVar27;
  pointer paVar28;
  pointer paVar29;
  double dVar30;
  pointer paVar31;
  bool ok;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> temp_contour;
  ContourVector contours;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> temp_contour2;
  ExPolygons poly;
  vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_> joined_openings;
  IfcVector3 nor;
  OpeningRefVector contours_to_openings;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> profile_verts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> profile_vertcnts;
  BoundingBox newbb;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour_flat;
  IfcMatrix4 minv;
  IfcMatrix4 m;
  pointer local_408;
  bool local_3f9;
  pointer local_3f8;
  pointer local_3f0;
  pointer local_3e8;
  pointer local_3e0;
  pointer local_3d8;
  undefined4 local_3cc;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> local_3c8;
  undefined4 local_3ac;
  vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
  local_3a8;
  pointer local_388;
  pointer local_380;
  pointer local_378;
  pointer local_370;
  pointer local_368;
  uint local_35c;
  pointer local_358;
  pointer pTStack_350;
  pointer local_348;
  pointer local_338;
  undefined8 uStack_330;
  undefined1 local_328 [32];
  __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
  local_308;
  __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
  _Stack_300;
  element_type *local_2f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  pointer local_2e8;
  pointer local_2e0;
  pointer local_2d8;
  undefined4 local_2cc;
  IfcVector3 local_2c8;
  vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  local_2a8;
  TempMesh *local_288;
  pointer local_280;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_278;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_260;
  undefined1 local_248 [128];
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *local_1c8;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *local_1c0;
  pointer local_1b8;
  long local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> local_148;
  IfcMatrix4 local_130;
  IfcMatrix4 local_b0;
  
  bVar20 = 0;
  local_2cc = (undefined4)CONCAT71(in_register_00000009,check_intersection);
  local_2a8.
  super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f9 = true;
  local_148.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.z = 0.0;
  local_2c8.x = 0.0;
  local_2c8.y = 0.0;
  ProjectOntoPlane(&local_b0,&local_148,curmesh,&local_3f9,&local_2c8);
  if (local_3f9 == false) {
    bVar20 = 0;
  }
  else {
    pIVar14 = &local_b0;
    paVar10 = (aiMatrix4x4t<double> *)local_248;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      paVar10->a1 = pIVar14->a1;
      pIVar14 = (IfcMatrix4 *)((long)pIVar14 + ((ulong)bVar20 * -2 + 1) * 8);
      paVar10 = (aiMatrix4x4t<double> *)((long)paVar10 + (ulong)bVar20 * -0x10 + 8);
    }
    paVar10 = aiMatrix4x4t<double>::Inverse((aiMatrix4x4t<double> *)local_248);
    pIVar14 = &local_130;
    for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
      pIVar14->a1 = paVar10->a1;
      paVar10 = (aiMatrix4x4t<double> *)((long)paVar10 + (ulong)bVar20 * -0x10 + 8);
      pIVar14 = (IfcMatrix4 *)((long)pIVar14 + ((ulong)bVar20 * -2 + 1) * 8);
    }
    local_3a8.
    super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3a8.
    super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ._M_impl.super__Vector_impl_data._M_start = (ProjectedWindowContour *)0x0;
    local_3a8.
    super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ._M_impl.super__Vector_impl_data._M_finish = (ProjectedWindowContour *)0x0;
    local_3c8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3c8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_348 = (pointer)0x0;
    local_358 = (pointer)0x0;
    pTStack_350 = (pointer)0x0;
    local_2e0 = (pointer)wall_extrusion_axis->x;
    local_2e8 = (pointer)wall_extrusion_axis->y;
    local_2f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)wall_extrusion_axis->z;
    dVar21 = (double)local_2f0._M_pi * (double)local_2f0._M_pi +
             (double)local_2e0 * (double)local_2e0 + (double)local_2e8 * (double)local_2e8;
    if (dVar21 < 0.0) {
      dVar21 = sqrt(dVar21);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
    pTVar13 = (openings->
              super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_1b8 = (openings->
                super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar13 == local_1b8) {
      bVar19 = true;
    }
    else {
      local_3ac = (undefined4)CONCAT71(in_register_00000081,generate_connection_geometry);
      dVar21 = 1.0 / dVar21;
      local_2e0 = (pointer)((double)local_2e0 * dVar21);
      local_2e8 = (pointer)((double)local_2e8 * dVar21);
      local_2f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2f0._M_pi * dVar21);
      local_35c = (uint)pTVar13;
      pTVar18 = pTVar13;
      local_288 = curmesh;
      local_1c8 = openings;
      local_1c0 = nors;
      do {
        dVar21 = (pTVar18->extrusionDir).x;
        paVar29 = (pointer)(pTVar18->extrusionDir).y;
        paVar31 = (pointer)(pTVar18->extrusionDir).z;
        dVar22 = (double)paVar31 * (double)paVar31 +
                 dVar21 * dVar21 + (double)paVar29 * (double)paVar29;
        dVar25 = 0.0;
        dVar26 = 0.0;
        dVar23 = 0.0;
        if (1e-10 < dVar22) {
          if (dVar22 < 0.0) {
            local_3d8 = paVar29;
            local_338 = paVar31;
            dVar22 = sqrt(dVar22);
            paVar29 = local_3d8;
            paVar31 = local_338;
          }
          else {
            dVar22 = SQRT(dVar22);
          }
          dVar22 = 1.0 / dVar22;
          dVar25 = dVar21 * dVar22;
          dVar26 = (double)paVar29 * dVar22;
          dVar23 = (double)paVar31 * dVar22;
        }
        __x = (pTVar18->profileMesh).
              super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar3 = (pTVar18->profileMesh2D).
                 super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pTVar13 = (pointer)CONCAT71((int7)((ulong)pTVar13 >> 8),1);
        local_3cc = SUB84(pTVar13,0);
        if (((peVar3 != (element_type *)0x0) &&
            (0.0 < dVar23 * dVar23 + dVar25 * dVar25 + dVar26 * dVar26)) &&
           (0.9 < ABS(dVar23 * local_2c8.z + dVar25 * local_2c8.x + dVar26 * local_2c8.y))) {
          local_3cc = 0;
          __x = peVar3;
        }
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                  (&local_278,&__x->mVerts);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_260,&__x->mVertcnt);
        if ((ulong)(((long)local_278.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_278.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
            3) {
LAB_005ca37a:
          local_408._0_4_ = 3;
        }
        else {
          if (local_3c8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_3c8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_3c8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_3c8.
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          if (pTStack_350 != local_358) {
            pTStack_350 = local_358;
          }
          local_370 = (pointer)0xc202a05f20000000;
          local_378 = (pointer)0xc202a05f20000000;
          local_408 = (pointer)0x4202a05f20000000;
          local_380 = (pointer)0x4202a05f20000000;
          local_388 = (pointer)0x4202a05f20000000;
          local_3f0 = (pointer)0xc202a05f20000000;
          local_3e0 = (pointer)0xc202a05f20000000;
          local_3f8 = (pointer)0x4202a05f20000000;
          local_3e8 = (pointer)0x4202a05f20000000;
          paVar29 = (pointer)0xc202a05f20000000;
          local_280 = pTVar18;
          if ((long)local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            local_1b0 = (long)local_260.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_260.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2;
            local_150 = local_b0.a1;
            local_158 = local_b0.a2;
            local_160 = local_b0.a3;
            local_168 = local_b0.a4;
            local_170 = local_b0.b1;
            local_178 = local_b0.b2;
            local_180 = local_b0.b3;
            local_188 = local_b0.b4;
            local_190 = local_b0.c1;
            local_198 = local_b0.c2;
            local_1a0 = local_b0.c3;
            local_1a8 = local_b0.c4;
            local_1b0 = local_1b0 + (ulong)(local_1b0 == 0);
            lVar16 = 0;
            lVar12 = 0;
            local_408 = (pointer)0x4202a05f20000000;
            local_3d8 = (pointer)0xc202a05f20000000;
            local_3e8 = (pointer)0x4202a05f20000000;
            local_3f8 = (pointer)0x4202a05f20000000;
            local_3e0 = (pointer)0xc202a05f20000000;
            local_3f0 = (pointer)0xc202a05f20000000;
            local_388 = (pointer)0x4202a05f20000000;
            local_380 = (pointer)0x4202a05f20000000;
            local_378 = (pointer)0xc202a05f20000000;
            local_370 = (pointer)0xc202a05f20000000;
            do {
              bVar19 = true;
              if ((byte)local_3cc == '\0') {
LAB_005c9f45:
                uVar2 = local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar16];
                if (uVar2 != 0) {
                  uVar17 = 0;
                  do {
                    local_368 = (pointer)local_278.
                                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar12].x;
                    local_2d8 = (pointer)local_278.
                                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar12].y;
                    local_338 = (pointer)local_278.
                                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar12].z;
                    paVar31 = (pointer)(local_160 * (double)local_338 +
                                        local_150 * (double)local_368 +
                                        local_158 * (double)local_2d8 + local_168);
                    paVar24 = (pointer)(local_180 * (double)local_338 +
                                        local_170 * (double)local_368 +
                                        (double)local_2d8 * local_178 + local_188);
                    paVar29 = (pointer)0x0;
                    if (0.0 <= (double)paVar31) {
                      paVar29 = paVar31;
                    }
                    paVar31 = (pointer)0x0;
                    if (0.0 <= (double)paVar24) {
                      paVar31 = paVar24;
                    }
                    local_248._0_8_ = (pointer)0x3ff0000000000000;
                    if ((double)paVar29 <= 1.0) {
                      local_248._0_8_ = paVar29;
                    }
                    local_248._8_8_ = (pointer)0x3ff0000000000000;
                    if ((double)paVar31 <= 1.0) {
                      local_248._8_8_ = paVar31;
                    }
                    if (bVar19) {
                      paVar29 = (pointer)local_248._0_8_;
                      if ((double)local_3e8 <= (double)local_248._0_8_) {
                        paVar29 = local_3e8;
                      }
                      paVar31 = (pointer)local_248._8_8_;
                      if ((double)local_3f8 <= (double)local_248._8_8_) {
                        paVar31 = local_3f8;
                      }
                      paVar24 = (pointer)local_248._0_8_;
                      if ((double)local_248._0_8_ <= (double)local_3e0) {
                        paVar24 = local_3e0;
                      }
                      paVar28 = (pointer)local_248._8_8_;
                      if ((double)local_248._8_8_ <= (double)local_3f0) {
                        paVar28 = local_3f0;
                      }
                      this = (vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)
                             &local_3c8;
                      local_3f8 = paVar31;
                      local_3f0 = paVar28;
                      local_3e8 = paVar29;
                      local_3e0 = paVar24;
                    }
                    else {
                      paVar29 = (pointer)local_248._0_8_;
                      if ((double)local_388 <= (double)local_248._0_8_) {
                        paVar29 = local_388;
                      }
                      paVar31 = (pointer)local_248._8_8_;
                      if ((double)local_380 <= (double)local_248._8_8_) {
                        paVar31 = local_380;
                      }
                      paVar24 = (pointer)local_248._0_8_;
                      if ((double)local_248._0_8_ <= (double)local_378) {
                        paVar24 = local_378;
                      }
                      paVar28 = (pointer)local_248._8_8_;
                      if ((double)local_248._8_8_ <= (double)local_370) {
                        paVar28 = local_370;
                      }
                      local_370 = paVar28;
                      local_378 = paVar24;
                      local_380 = paVar31;
                      local_388 = paVar29;
                      this = (vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)
                             &local_358;
                    }
                    pdVar4 = *(double **)this;
                    pdVar5 = *(double **)(this + 8);
                    bVar8 = pdVar4 != pdVar5;
                    if (pdVar4 == pdVar5) {
LAB_005ca159:
                      if (!bVar8) {
                        __position._M_current = *(aiVector2t<double> **)(this + 8);
                        if (__position._M_current == *(aiVector2t<double> **)(this + 0x10)) {
                          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
                          _M_realloc_insert<aiVector2t<double>const&>
                                    (this,__position,(aiVector2t<double> *)local_248);
                        }
                        else {
                          (__position._M_current)->x = (double)local_248._0_8_;
                          (__position._M_current)->y = (double)local_248._8_8_;
                          *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
                        }
                      }
                    }
                    else if (9.999999747378752e-06 <=
                             (*pdVar4 - (double)local_248._0_8_) *
                             (*pdVar4 - (double)local_248._0_8_) +
                             (pdVar4[1] - (double)local_248._8_8_) *
                             (pdVar4[1] - (double)local_248._8_8_)) {
                      do {
                        pdVar11 = pdVar4 + 2;
                        bVar8 = pdVar11 != pdVar5;
                        if (pdVar11 == pdVar5) break;
                        pdVar1 = pdVar4 + 3;
                        pdVar4 = pdVar11;
                      } while (9.999999747378752e-06 <=
                               (*pdVar11 - (double)local_248._0_8_) *
                               (*pdVar11 - (double)local_248._0_8_) +
                               (*pdVar1 - (double)local_248._8_8_) *
                               (*pdVar1 - (double)local_248._8_8_));
                      goto LAB_005ca159;
                    }
                    paVar31 = (pointer)((double)local_338 * local_1a0 +
                                        (double)local_368 * local_190 +
                                        (double)local_2d8 * local_198 + local_1a8);
                    paVar29 = paVar31;
                    if ((double)local_408 <= (double)paVar31) {
                      paVar29 = local_408;
                    }
                    if ((double)paVar31 <= (double)local_3d8) {
                      paVar31 = local_3d8;
                    }
                    uVar17 = uVar17 + 1;
                    lVar12 = lVar12 + 1;
                    local_408 = paVar29;
                    local_3d8 = paVar31;
                  } while (uVar17 != uVar2);
                }
              }
              else {
                dVar21 = local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12 + 2].x -
                         local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12].x;
                dVar23 = local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12 + 2].y -
                         local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12].y;
                dVar30 = local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12 + 2].z -
                         local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12].z;
                dVar25 = local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12 + 1].x -
                         local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12].x;
                dVar26 = local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12 + 1].y -
                         local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12].y;
                dVar22 = local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12 + 1].z -
                         local_278.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar12].z;
                paVar27 = (pointer)(dVar23 * dVar22 - dVar26 * dVar30);
                paVar31 = (pointer)(dVar30 * dVar25 - dVar22 * dVar21);
                paVar29 = (pointer)(dVar26 * dVar21 - dVar25 * dVar23);
                dVar21 = (double)paVar29 * (double)paVar29 +
                         (double)paVar27 * (double)paVar27 + (double)paVar31 * (double)paVar31;
                if (dVar21 < 0.0) {
                  uStack_330 = 0;
                  local_368 = paVar31;
                  local_338 = paVar29;
                  local_2d8 = paVar27;
                  dVar21 = sqrt(dVar21);
                  paVar27 = local_2d8;
                  paVar29 = local_338;
                  paVar31 = local_368;
                }
                else {
                  dVar21 = SQRT(dVar21);
                }
                dVar21 = 1.0 / dVar21;
                dVar22 = (double)paVar29 * dVar21 * local_2c8.z +
                         (double)paVar27 * dVar21 * local_2c8.x +
                         (double)paVar31 * dVar21 * local_2c8.y;
                dVar21 = ABS(dVar22);
                if (dVar21 < 0.9) {
                  lVar12 = lVar12 + (ulong)local_260.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar16];
                }
                bVar19 = dVar21 < 0.9 || 0.0 < dVar22;
                if (0.9 <= dVar21) goto LAB_005c9f45;
              }
              lVar16 = lVar16 + 1;
              paVar29 = local_3d8;
            } while (lVar16 != local_1b0);
          }
          pTVar18 = local_280;
          pTVar13 = local_358;
          paVar28 = local_3c8.
                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          paVar24 = local_3c8.
                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          paVar31 = local_3c8.
                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (0x20 < (ulong)((long)pTStack_350 - (long)local_358)) {
            if ((byte)local_3cc == 0) {
              __assert_fail("!is_2d_source",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                            ,0x508,
                            "bool Assimp::IFC::GenerateOpenings(std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &, bool, bool, const IfcVector3 &)"
                           );
            }
            if (((ulong)((long)local_3c8.
                               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3c8.
                              super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) < 0x21) ||
               (ABS(((double)local_3e0 - (double)local_3e8) *
                    ((double)local_3f0 - (double)local_3f8)) <
                ABS(((double)local_378 - (double)local_388) *
                    ((double)local_370 - (double)local_380)))) {
              local_3c8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_358;
              local_3c8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pTStack_350;
              local_3c8.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = local_348;
              local_358 = (pointer)paVar31;
              pTStack_350 = (pointer)paVar24;
              local_348 = paVar28;
              local_3f0 = local_370;
              local_3e0 = local_378;
              local_3f8 = local_380;
              local_3e8 = local_388;
            }
          }
          if ((ulong)((long)local_3c8.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_3c8.
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_005ca37a;
          iVar9 = 3;
          local_408._0_4_ = iVar9;
          if (((((byte)local_3cc & (byte)local_2cc) != 1) ||
              ((dVar21 = ABS((double)paVar29 - (double)local_408) * 0.0001,
               bVar19 = (double)local_408 <= dVar21, bVar19 && (0.0 <= (double)paVar29 + dVar21))))
             && (1e-10 <= ABS(((double)local_3f0 - (double)local_3f8) *
                              ((double)local_3e0 - (double)local_3e8)))) {
            local_308._M_current = (TempOpening **)0x0;
            _Stack_300._M_current = (TempOpening **)0x0;
            local_2f8 = (element_type *)0x0;
            local_308._M_current = (TempOpening **)operator_new(8);
            pTVar13 = (pointer)&(((element_type *)local_308._M_current)->mVerts).
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
            (((element_type *)local_308._M_current)->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)pTVar18;
            bVar19 = (long)local_3c8.
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_3c8.
                           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start == 0x40;
            __position_00._M_current =
                 local_3a8.
                 super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            _Stack_300._M_current = (TempOpening **)pTVar13;
            local_2f8 = (element_type *)pTVar13;
            do {
              if (__position_00._M_current ==
                  local_3a8.
                  super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                local_408._0_4_ = 10;
                break;
              }
              if (((((double)local_3e0 < ((__position_00._M_current)->bb).first.x ||
                     (double)local_3e0 == ((__position_00._M_current)->bb).first.x) ||
                   (((__position_00._M_current)->bb).second.x <= (double)local_3e8)) ||
                  (pdVar4 = &((__position_00._M_current)->bb).first.y,
                  (double)local_3f0 < *pdVar4 || (double)local_3f0 == *pdVar4)) ||
                 (((__position_00._M_current)->bb).second.y <= (double)local_3f8)) {
                __position_00._M_current = __position_00._M_current + 1;
                local_408._0_4_ = 0;
              }
              else {
                if ((__position_00._M_current)->is_rectangular == false) {
                  bVar19 = false;
                }
                local_328._0_8_ = (pointer)0x0;
                local_328._8_8_ = (pointer)0x0;
                local_328._16_8_ = (pointer)0x0;
                MakeDisjunctWindowContours
                          (&(__position_00._M_current)->contour,&local_3c8,(ExPolygons *)local_328);
                poly_00 = local_328._0_8_;
                if (local_328._8_8_ - local_328._0_8_ == 0x30) {
                  GetBoundingBox((Polygon *)local_328._0_8_);
                  uVar7 = local_248._16_8_;
                  bVar8 = false;
                  if (((__position_00._M_current)->bb).first.x <= (double)local_248._16_8_ &&
                      (double)local_248._16_8_ != ((__position_00._M_current)->bb).first.x) {
                    if ((((__position_00._M_current)->bb).second.x <= (double)local_248._0_8_) ||
                       (pdVar4 = &((__position_00._M_current)->bb).first.y,
                       (double)local_248._24_8_ < *pdVar4 || (double)local_248._24_8_ == *pdVar4)) {
                      bVar8 = false;
                    }
                    else {
                      bVar8 = (double)local_248._8_8_ < ((__position_00._M_current)->bb).second.y;
                    }
                  }
                  if (bVar8) goto LAB_005ca644;
                  local_3e8 = (pointer)local_248._0_8_;
                  local_3f8 = (pointer)local_248._8_8_;
                  local_3f0 = (pointer)local_248._24_8_;
                  ExtractVerticesFromClipper((Polygon *)poly_00,&local_3c8,false);
                  local_3e0 = (pointer)uVar7;
                  local_408._0_4_ = 0xb;
                }
                else {
LAB_005ca644:
                  MergeWindowContours(&local_3c8,&(__position_00._M_current)->contour,
                                      (ExPolygons *)local_328);
                  pTVar13 = (pointer)local_328._8_8_;
                  if ((ulong)(((long)(local_328._8_8_ - local_328._0_8_) >> 4) * -0x5555555555555555
                             ) < 2) {
                    if (local_328._8_8_ == local_328._0_8_) {
                      LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x5ca7f6);
                      local_408._0_4_ = 10;
                      if (local_3c8.
                          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          local_3c8.
                          super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
                        local_3c8.
                        super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             local_3c8.
                             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                      }
                    }
                    else {
                      LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5ca6c2);
                      ExtractVerticesFromClipper((Polygon *)local_328._0_8_,&local_3c8,false);
                      paVar29 = (pointer)((__position_00._M_current)->bb).first.x;
                      local_3d8 = (pointer)((__position_00._M_current)->bb).first.y;
                      local_338 = (pointer)((__position_00._M_current)->bb).second.x;
                      local_368 = (pointer)((__position_00._M_current)->bb).second.y;
                      if ((char)local_3ac != '\0') {
                        lVar12 = ((ulong)((long)__position_00._M_current -
                                         (long)local_3a8.
                                               super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                 0x6276276276276278;
                        pTVar13 = *(pointer *)
                                   ((long)local_2a8.
                                          super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar12 + 8);
                        std::
                        vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>
                        ::
                        _M_range_insert<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening**,std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>>
                                  ((vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>
                                    *)&local_308,_Stack_300._M_current,
                                   *(undefined8 *)
                                    ((long)local_2a8.
                                           super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar12),
                                   pTVar13);
                        std::
                        vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                        ::_M_erase(&local_2a8,
                                   (vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                                    *)(((ulong)((long)__position_00._M_current -
                                               (long)local_3a8.
                                                                                                          
                                                  super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                       0x6276276276276278 +
                                      (long)local_2a8.
                                            super__Vector_base<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start));
                      }
                      std::
                      vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                      ::_M_erase(&local_3a8,__position_00);
                      if ((double)local_3e8 <= (double)paVar29) {
                        paVar29 = local_3e8;
                      }
                      paVar31 = local_3d8;
                      if ((double)local_3f8 <= (double)local_3d8) {
                        paVar31 = local_3f8;
                      }
                      paVar24 = local_338;
                      if ((double)local_338 <= (double)local_3e0) {
                        paVar24 = local_3e0;
                      }
                      paVar28 = local_368;
                      if ((double)local_368 <= (double)local_3f0) {
                        paVar28 = local_3f0;
                      }
                      local_408._0_4_ = 0xb;
                      __position_00._M_current =
                           local_3a8.
                           super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      local_3f8 = paVar31;
                      local_3f0 = paVar28;
                      local_3e8 = paVar29;
                      local_3e0 = paVar24;
                    }
                  }
                  else {
                    bVar8 = TryAddOpenings_Poly2Tri(local_1c8,local_1c0,local_288);
                    local_35c = (uint)CONCAT71(extraout_var,bVar8);
                    local_408._0_4_ = 1;
                  }
                }
                std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector
                          ((vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_> *)
                           local_328);
              }
            } while (((int)local_408 == 0xb) || ((int)local_408 == 0));
            if ((int)local_408 == 10) {
              if (local_3c8.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_3c8.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                if ((char)local_3ac != '\0') {
                  pTVar13 = (pointer)local_328;
                  std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>::
                  vector<__gnu_cxx::__normal_iterator<Assimp::IFC::TempOpening**,std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>,void>
                            ((vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>
                              *)local_248,local_308,_Stack_300,(allocator_type *)pTVar13);
                  std::
                  vector<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>,std::allocator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>>
                  ::
                  emplace_back<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>
                            ((vector<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>,std::allocator<std::vector<Assimp::IFC::TempOpening*,std::allocator<Assimp::IFC::TempOpening*>>>>
                              *)&local_2a8,
                             (vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                              *)local_248);
                  if ((pointer)local_248._0_8_ != (pointer)0x0) {
                    operator_delete((void *)local_248._0_8_);
                  }
                }
                std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::vector
                          ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                           local_248,&local_3c8);
                local_248._24_8_ = local_3e8;
                local_248._32_8_ = local_3f8;
                local_248._40_8_ = local_3e0;
                local_248._48_8_ = local_3f0;
                local_248._56_8_ = (_Bit_type *)0x0;
                local_248._64_4_ = 0;
                local_248._72_8_ = (_Bit_type *)0x0;
                local_248._80_4_ = 0;
                local_248._88_8_ = (_Bit_pointer)0x0;
                local_248[0x60] = bVar19;
                std::
                vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                ::emplace_back<Assimp::IFC::ProjectedWindowContour>
                          (&local_3a8,(ProjectedWindowContour *)local_248);
                if ((_Bit_type *)local_248._56_8_ != (_Bit_type *)0x0) {
                  operator_delete((void *)local_248._56_8_);
                  local_248._56_8_ = (_Bit_type *)0x0;
                  local_248._64_4_ = 0;
                  local_248._72_8_ = (_Bit_type *)0x0;
                  local_248._80_4_ = 0;
                  local_248._88_8_ = (_Bit_pointer)0x0;
                }
                if ((pointer)local_248._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_248._0_8_);
                }
              }
              local_408._0_4_ = 0;
            }
            if ((element_type *)local_308._M_current != (element_type *)0x0) {
              operator_delete(local_308._M_current);
            }
          }
        }
        if (local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_260.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_278.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (((int)local_408 != 3) && ((int)local_408 != 0)) goto LAB_005ca996;
        pTVar18 = pTVar18 + 1;
      } while (pTVar18 != local_1b8);
      local_408._0_4_ = 2;
LAB_005ca996:
      bVar19 = (int)local_408 == 2;
      generate_connection_geometry = SUB41(local_3ac,0);
      wall_extrusion_axis = (IfcVector3 *)(ulong)local_35c;
      curmesh = local_288;
    }
    bVar20 = (byte)wall_extrusion_axis;
    if (bVar19) {
      if (local_3a8.
          super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_3a8.
          super__Vector_base<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar20 = 0;
      }
      else {
        TempMesh::Clear(curmesh);
        pTVar15 = curmesh;
        Quadrify(&local_3a8,curmesh);
        CleanupWindowContours(&local_3a8);
        InsertWindowContours
                  (&local_3a8,
                   (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
                   pTVar15,curmesh);
        CleanupOuterContour(&local_148,curmesh);
        paVar27 = (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        paVar6 = (curmesh->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (paVar27 != paVar6) {
          local_3d8 = (pointer)local_130.a2;
          do {
            dVar21 = paVar27->x;
            dVar22 = paVar27->y;
            dVar23 = paVar27->z;
            paVar27->x = local_130.a3 * dVar23 + local_130.a1 * dVar21 + local_130.a2 * dVar22 +
                         local_130.a4;
            paVar27->y = local_130.b3 * dVar23 + local_130.b1 * dVar21 + dVar22 * local_130.b2 +
                         local_130.b4;
            paVar27->z = dVar23 * local_130.c3 + dVar21 * local_130.c1 + dVar22 * local_130.c2 +
                         local_130.c4;
            paVar27 = paVar27 + 1;
          } while (paVar27 != paVar6);
        }
        bVar20 = 1;
        if (generate_connection_geometry != false) {
          CloseWindows(&local_3a8,&local_130,&local_2a8,curmesh);
        }
      }
    }
    if (local_358 != (pointer)0x0) {
      operator_delete(local_358);
    }
    if ((pointer)local_3c8.
                 super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3c8.
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
    ::~vector(&local_3a8);
  }
  if (local_148.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
  ::~vector(&local_2a8);
  return (bool)(bVar20 & 1);
}

Assistant:

bool GenerateOpenings(std::vector<TempOpening>& openings,
    const std::vector<IfcVector3>& nors,
    TempMesh& curmesh,
    bool check_intersection,
    bool generate_connection_geometry,
    const IfcVector3& wall_extrusion_axis)
{
    OpeningRefVector contours_to_openings;

    // Try to derive a solid base plane within the current surface for use as
    // working coordinate system. Map all vertices onto this plane and
    // rescale them to [0,1] range. This normalization means all further
    // epsilons need not be scaled.
    bool ok = true;

    std::vector<IfcVector2> contour_flat;

    IfcVector3 nor;
    const IfcMatrix4 m = ProjectOntoPlane(contour_flat, curmesh,  ok, nor);
    if(!ok) {
        return false;
    }

    // Obtain inverse transform for getting back to world space later on
    const IfcMatrix4 minv = IfcMatrix4(m).Inverse();

    // Compute bounding boxes for all 2D openings in projection space
    ContourVector contours;

    std::vector<IfcVector2> temp_contour;
    std::vector<IfcVector2> temp_contour2;

    IfcVector3 wall_extrusion_axis_norm = wall_extrusion_axis;
    wall_extrusion_axis_norm.Normalize();

    for(TempOpening& opening :openings) {

        // extrusionDir may be 0,0,0 on case where the opening mesh is not an
        // IfcExtrudedAreaSolid but something else (i.e. a brep)
        IfcVector3 norm_extrusion_dir = opening.extrusionDir;
        if (norm_extrusion_dir.SquareLength() > 1e-10) {
            norm_extrusion_dir.Normalize();
        }
        else {
            norm_extrusion_dir = IfcVector3();
        }

        TempMesh* profile_data =  opening.profileMesh.get();
        bool is_2d_source = false;
        if (opening.profileMesh2D && norm_extrusion_dir.SquareLength() > 0) {

            if(std::fabs(norm_extrusion_dir * wall_extrusion_axis_norm) < 0.1) {
                // horizontal extrusion
                if (std::fabs(norm_extrusion_dir * nor) > 0.9) {
                    profile_data = opening.profileMesh2D.get();
                    is_2d_source = true;
                }
            }
            else {
                // vertical extrusion
                if (std::fabs(norm_extrusion_dir * nor) > 0.9) {
                    profile_data = opening.profileMesh2D.get();
                    is_2d_source = true;
                }
            }
        }
        std::vector<IfcVector3> profile_verts = profile_data->mVerts;
        std::vector<unsigned int> profile_vertcnts = profile_data->mVertcnt;
        if(profile_verts.size() <= 2) {
            continue;
        }

        // The opening meshes are real 3D meshes so skip over all faces
        // clearly facing into the wrong direction. Also, we need to check
        // whether the meshes do actually intersect the base surface plane.
        // This is done by recording minimum and maximum values for the
        // d component of the plane equation for all polys and checking
        // against surface d.

        // Use the sign of the dot product of the face normal to the plane
        // normal to determine to which side of the difference mesh a
        // triangle belongs. Get independent bounding boxes and vertex
        // sets for both sides and take the better one (we can't just
        // take both - this would likely cause major screwup of vertex
        // winding, producing errors as late as in CloseWindows()).
        IfcFloat dmin, dmax;
        MinMaxChooser<IfcFloat>()(dmin,dmax);

        temp_contour.clear();
        temp_contour2.clear();

        IfcVector2 vpmin,vpmax;
        MinMaxChooser<IfcVector2>()(vpmin,vpmax);

        IfcVector2 vpmin2,vpmax2;
        MinMaxChooser<IfcVector2>()(vpmin2,vpmax2);

        for (size_t f = 0, vi_total = 0, fend = profile_vertcnts.size(); f < fend; ++f) {

            bool side_flag = true;
            if (!is_2d_source) {
                const IfcVector3 face_nor = ((profile_verts[vi_total+2] - profile_verts[vi_total]) ^
                    (profile_verts[vi_total+1] - profile_verts[vi_total])).Normalize();

                const IfcFloat abs_dot_face_nor = std::abs(nor * face_nor);
                if (abs_dot_face_nor < 0.9) {
                    vi_total += profile_vertcnts[f];
                    continue;
                }

                side_flag = nor * face_nor > 0;
            }

            for (unsigned int vi = 0, vend = profile_vertcnts[f]; vi < vend; ++vi, ++vi_total) {
                const IfcVector3& x = profile_verts[vi_total];

                const IfcVector3 v = m * x;
                IfcVector2 vv(v.x, v.y);

                //if(check_intersection) {
                    dmin = std::min(dmin, v.z);
                    dmax = std::max(dmax, v.z);
                //}

                // sanity rounding
                vv = std::max(vv,IfcVector2());
                vv = std::min(vv,one_vec);

                if(side_flag) {
                    vpmin = std::min(vpmin,vv);
                    vpmax = std::max(vpmax,vv);
                }
                else {
                    vpmin2 = std::min(vpmin2,vv);
                    vpmax2 = std::max(vpmax2,vv);
                }

                std::vector<IfcVector2>& store = side_flag ? temp_contour : temp_contour2;

                if (!IsDuplicateVertex(vv, store)) {
                    store.push_back(vv);
                }
            }
        }

        if (temp_contour2.size() > 2) {
            ai_assert(!is_2d_source);
            const IfcVector2 area = vpmax-vpmin;
            const IfcVector2 area2 = vpmax2-vpmin2;
            if (temp_contour.size() <= 2 || std::fabs(area2.x * area2.y) > std::fabs(area.x * area.y)) {
                temp_contour.swap(temp_contour2);

                vpmax = vpmax2;
                vpmin = vpmin2;
            }
        }
        if(temp_contour.size() <= 2) {
            continue;
        }

        // TODO: This epsilon may be too large
        const IfcFloat epsilon = std::fabs(dmax-dmin) * 0.0001;
        if (!is_2d_source && check_intersection && (0 < dmin-epsilon || 0 > dmax+epsilon)) {
            continue;
        }

        BoundingBox bb = BoundingBox(vpmin,vpmax);

        // Skip over very small openings - these are likely projection errors
        // (i.e. they don't belong to this side of the wall)
        if(std::fabs(vpmax.x - vpmin.x) * std::fabs(vpmax.y - vpmin.y) < static_cast<IfcFloat>(1e-10)) {
            continue;
        }
        std::vector<TempOpening*> joined_openings(1, &opening);

        bool is_rectangle = temp_contour.size() == 4;

        // See if this BB intersects or is in close adjacency to any other BB we have so far.
        for (ContourVector::iterator it = contours.begin(); it != contours.end(); ) {
            const BoundingBox& ibb = (*it).bb;

            if (BoundingBoxesOverlapping(ibb, bb)) {

                if (!(*it).is_rectangular) {
                    is_rectangle = false;
                }

                const std::vector<IfcVector2>& other = (*it).contour;
                ClipperLib::ExPolygons poly;

                // First check whether subtracting the old contour (to which ibb belongs)
                // from the new contour (to which bb belongs) yields an updated bb which
                // no longer overlaps ibb
                MakeDisjunctWindowContours(other, temp_contour, poly);
                if(poly.size() == 1) {

                    const BoundingBox newbb = GetBoundingBox(poly[0].outer);
                    if (!BoundingBoxesOverlapping(ibb, newbb )) {
                         // Good guy bounding box
                         bb = newbb ;

                         ExtractVerticesFromClipper(poly[0].outer, temp_contour, false);
                         continue;
                    }
                }

                // Take these two overlapping contours and try to merge them. If they
                // overlap (which should not happen, but in fact happens-in-the-real-
                // world [tm] ), resume using a single contour and a single bounding box.
                MergeWindowContours(temp_contour, other, poly);

                if (poly.size() > 1) {
                    return TryAddOpenings_Poly2Tri(openings, nors, curmesh);
                }
                else if (poly.size() == 0) {
                    IFCImporter::LogWarn("ignoring duplicate opening");
                    temp_contour.clear();
                    break;
                }
                else {
                    IFCImporter::LogDebug("merging overlapping openings");
                    ExtractVerticesFromClipper(poly[0].outer, temp_contour, false);

                    // Generate the union of the bounding boxes
                    bb.first = std::min(bb.first, ibb.first);
                    bb.second = std::max(bb.second, ibb.second);

                    // Update contour-to-opening tables accordingly
                    if (generate_connection_geometry) {
                        std::vector<TempOpening*>& t = contours_to_openings[std::distance(contours.begin(),it)];
                        joined_openings.insert(joined_openings.end(), t.begin(), t.end());

                        contours_to_openings.erase(contours_to_openings.begin() + std::distance(contours.begin(),it));
                    }

                    contours.erase(it);

                    // Restart from scratch because the newly formed BB might now
                    // overlap any other BB which its constituent BBs didn't
                    // previously overlap.
                    it = contours.begin();
                    continue;
                }
            }
            ++it;
        }

        if(!temp_contour.empty()) {
            if (generate_connection_geometry) {
                contours_to_openings.push_back(std::vector<TempOpening*>(
                    joined_openings.begin(),
                    joined_openings.end()));
            }

            contours.push_back(ProjectedWindowContour(temp_contour, bb, is_rectangle));
        }
    }

    // Check if we still have any openings left - it may well be that this is
    // not the cause, for example if all the opening candidates don't intersect
    // this surface or point into a direction perpendicular to it.
    if (contours.empty()) {
        return false;
    }

    curmesh.Clear();

    // Generate a base subdivision into quads to accommodate the given list
    // of window bounding boxes.
    Quadrify(contours,curmesh);

    // Run a sanity cleanup pass on the window contours to avoid generating
    // artifacts during the contour generation phase later on.
    CleanupWindowContours(contours);

    // Previously we reduced all windows to rectangular AABBs in projection
    // space, now it is time to fill the gaps between the BBs and the real
    // window openings.
    InsertWindowContours(contours,openings, curmesh);

    // Clip the entire outer contour of our current result against the real
    // outer contour of the surface. This is necessary because the result
    // of the Quadrify() algorithm is always a square area spanning
    // over [0,1]^2 (i.e. entire projection space).
    CleanupOuterContour(contour_flat, curmesh);

    // Undo the projection and get back to world (or local object) space
    for(IfcVector3& v3 : curmesh.mVerts) {
        v3 = minv * v3;
    }

    // Generate window caps to connect the symmetric openings on both sides
    // of the wall.
    if (generate_connection_geometry) {
        CloseWindows(contours, minv, contours_to_openings, curmesh);
    }
    return true;
}